

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS,realtype beta)

{
  realtype beta_local;
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if (0.0 < beta) {
    if (1.0 <= beta) {
      *(undefined8 *)((long)NLS->content + 0x28) = 0x3ff0000000000000;
      *(undefined4 *)((long)NLS->content + 0x20) = 0;
    }
    else {
      *(realtype *)((long)NLS->content + 0x28) = beta;
      *(undefined4 *)((long)NLS->content + 0x20) = 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = -0x387;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSetDamping_FixedPoint(SUNNonlinearSolver NLS, realtype beta)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that beta is a vaild */
  if (beta <= ZERO)
    return(SUN_NLS_ILL_INPUT);

  if (beta < ONE) {
    /* enable damping */
    FP_CONTENT(NLS)->beta    = beta;
    FP_CONTENT(NLS)->damping = SUNTRUE;
  } else {
    /* disable damping */
    FP_CONTENT(NLS)->beta    = ONE;
    FP_CONTENT(NLS)->damping = SUNFALSE;
  }

  return(SUN_NLS_SUCCESS);
}